

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_util.hpp
# Opt level: O2

bool units::detail::times_overflows(unit_data *a,unit_data *b)

{
  bool bVar1;
  
  bVar1 = base_access<0>::plus_overflows<units::detail::unit_data>(a,b);
  if (!bVar1) {
    bVar1 = base_access<1>::plus_overflows<units::detail::unit_data>(a,b);
    if (!bVar1) {
      bVar1 = base_access<2>::plus_overflows<units::detail::unit_data>(a,b);
      if (!bVar1) {
        bVar1 = base_access<3>::plus_overflows<units::detail::unit_data>(a,b);
        if (!bVar1) {
          bVar1 = base_access<4>::plus_overflows<units::detail::unit_data>(a,b);
          if (!bVar1) {
            bVar1 = base_access<5>::plus_overflows<units::detail::unit_data>(a,b);
            if (!bVar1) {
              bVar1 = base_access<6>::plus_overflows<units::detail::unit_data>(a,b);
              if (!bVar1) {
                bVar1 = base_access<7>::plus_overflows<units::detail::unit_data>(a,b);
                if (!bVar1) {
                  bVar1 = base_access<8>::plus_overflows<units::detail::unit_data>(a,b);
                  if (!bVar1) {
                    bVar1 = base_access<9>::plus_overflows<units::detail::unit_data>(a,b);
                    return bVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool times_overflows(const unit_data& a, const unit_data& b)
    {
        return (
            base_access<0>::plus_overflows(a, b) ||
            base_access<1>::plus_overflows(a, b) ||
            base_access<2>::plus_overflows(a, b) ||
            base_access<3>::plus_overflows(a, b) ||
            base_access<4>::plus_overflows(a, b) ||
            base_access<5>::plus_overflows(a, b) ||
            base_access<6>::plus_overflows(a, b) ||
            base_access<7>::plus_overflows(a, b) ||
            base_access<8>::plus_overflows(a, b) ||
            base_access<9>::plus_overflows(a, b));
    }